

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

int __thiscall
gtl::internal_btree::
btree_node<gtl::internal_btree::map_params<S2CellId,S2ShapeIndexCell*,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2ShapeIndexCell*>>,256,false>>
::linear_search_plain_compare<S2CellId,std::less<S2CellId>>
          (btree_node<gtl::internal_btree::map_params<S2CellId,S2ShapeIndexCell*,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2ShapeIndexCell*>>,256,false>>
           *this,S2CellId *k,int s,int e,less<S2CellId> *comp)

{
  bool bVar1;
  key_type *__x;
  less<S2CellId> *comp_local;
  int e_local;
  int s_local;
  S2CellId *k_local;
  btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
  *this_local;
  
  comp_local._4_4_ = s;
  while( true ) {
    if (e <= comp_local._4_4_) {
      return comp_local._4_4_;
    }
    __x = btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
          ::key((btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                 *)this,comp_local._4_4_);
    bVar1 = std::less<S2CellId>::operator()(comp,__x,k);
    if (!bVar1) break;
    comp_local._4_4_ = comp_local._4_4_ + 1;
  }
  return comp_local._4_4_;
}

Assistant:

int linear_search_plain_compare(const K &k, int s, const int e,
                                  const Compare &comp) const {
    while (s < e) {
      if (!comp(key(s), k)) {
        break;
      }
      ++s;
    }
    return s;
  }